

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cloud.c
# Opt level: O2

REF_STATUS ref_cloud_create(REF_CLOUD *ref_cloud_ptr,REF_INT naux)

{
  REF_CLOUD pRVar1;
  REF_GLOB *pRVar2;
  REF_DBL *pRVar3;
  char *pcVar4;
  undefined8 uStack_20;
  
  pRVar1 = (REF_CLOUD)malloc(0x20);
  *ref_cloud_ptr = pRVar1;
  if (pRVar1 == (REF_CLOUD)0x0) {
    pcVar4 = "malloc *ref_cloud_ptr of REF_CLOUD_STRUCT NULL";
    uStack_20 = 0x1e;
  }
  else {
    pRVar1->n = 0;
    pRVar1->max = 0x14;
    pRVar1->naux = naux;
    pRVar2 = (REF_GLOB *)malloc(0xa0);
    pRVar1->global = pRVar2;
    if (pRVar2 == (REF_GLOB *)0x0) {
      pcVar4 = "malloc ref_cloud->global of REF_GLOB NULL";
      uStack_20 = 0x26;
    }
    else {
      if (naux < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cloud.c",
               0x28,"ref_cloud_create","malloc ref_cloud->aux of REF_DBL negative");
        return 1;
      }
      pRVar3 = (REF_DBL *)malloc((ulong)(uint)(naux * 0x14) << 3);
      pRVar1->aux = pRVar3;
      if (pRVar3 != (REF_DBL *)0x0) {
        return 0;
      }
      pcVar4 = "malloc ref_cloud->aux of REF_DBL NULL";
      uStack_20 = 0x28;
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cloud.c",uStack_20
         ,"ref_cloud_create",pcVar4);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_cloud_create(REF_CLOUD *ref_cloud_ptr, REF_INT naux) {
  REF_CLOUD ref_cloud;

  ref_malloc(*ref_cloud_ptr, 1, REF_CLOUD_STRUCT);

  ref_cloud = (*ref_cloud_ptr);

  ref_cloud_n(ref_cloud) = 0;
  ref_cloud_max(ref_cloud) = 20;
  ref_cloud_naux(ref_cloud) = naux;

  ref_malloc(ref_cloud->global, ref_cloud_max(ref_cloud), REF_GLOB);
  ref_malloc(ref_cloud->aux,
             ref_cloud_naux(ref_cloud) * ref_cloud_max(ref_cloud), REF_DBL);

  return REF_SUCCESS;
}